

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_punpcklbh_mips(uint64_t fs,uint64_t ft)

{
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  LMIValue vt;
  LMIValue vs;
  LMIValue vd;
  uint host;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.ub[0] = (uint8_t)fs;
  vs.ub[0] = vt.ub[0];
  local_38 = (uint8_t)ft;
  vs.ub[1] = local_38;
  vt.ub[1] = (uint8_t)(fs >> 8);
  vs.ub[2] = vt.ub[1];
  uStack_37 = (uint8_t)(ft >> 8);
  vs.ub[3] = uStack_37;
  vt.ub[2] = (uint8_t)(fs >> 0x10);
  vs.ub[4] = vt.ub[2];
  uStack_36 = (uint8_t)(ft >> 0x10);
  vs.ub[5] = uStack_36;
  vt.ub[3] = (uint8_t)(fs >> 0x18);
  vs.ub[6] = vt.ub[3];
  uStack_35 = (uint8_t)(ft >> 0x18);
  vs.ub[7] = uStack_35;
  return vs.d;
}

Assistant:

uint64_t helper_punpcklbh(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(7);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.ub[0 ^ host] = vs.ub[0 ^ host];
    vd.ub[1 ^ host] = vt.ub[0 ^ host];
    vd.ub[2 ^ host] = vs.ub[1 ^ host];
    vd.ub[3 ^ host] = vt.ub[1 ^ host];
    vd.ub[4 ^ host] = vs.ub[2 ^ host];
    vd.ub[5 ^ host] = vt.ub[2 ^ host];
    vd.ub[6 ^ host] = vs.ub[3 ^ host];
    vd.ub[7 ^ host] = vt.ub[3 ^ host];

    return vd.d;
}